

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

string * __thiscall
soul::TokenisedPathString::getLastPart_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  bool bVar1;
  Section *pSVar2;
  TokenisedPathString *this_local;
  
  bVar1 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::empty(&this->sections);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pSVar2 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::back(&this->sections);
    getSection_abi_cxx11_(__return_storage_ptr__,this,*pSVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLastPart() const
    {
        if (sections.empty())
            return {};

        return getSection (sections.back());
    }